

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_check_san(mbedtls_x509_sequence *san,char *cn,size_t cn_len)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  mbedtls_x509_sequence *local_38;
  mbedtls_x509_sequence *cur;
  int san_uri;
  int san_ip;
  size_t cn_len_local;
  char *cn_local;
  mbedtls_x509_sequence *san_local;
  
  bVar1 = false;
  bVar2 = false;
  local_38 = san;
  do {
    if (local_38 == (mbedtls_x509_sequence *)0x0) {
      if ((bVar1) && (iVar4 = x509_crt_check_san_ip(san,cn,cn_len), iVar4 == 0)) {
        san_local._4_4_ = 0;
      }
      else if ((bVar2) && (iVar4 = x509_crt_check_san_uri(san,cn,cn_len), iVar4 == 0)) {
        san_local._4_4_ = 0;
      }
      else {
        san_local._4_4_ = -1;
      }
      return san_local._4_4_;
    }
    uVar3 = (local_38->buf).tag & 0x1f;
    if (uVar3 == 2) {
      iVar4 = x509_crt_check_cn(&local_38->buf,cn,cn_len);
      if (iVar4 == 0) {
        return 0;
      }
    }
    else if (uVar3 == 6) {
      bVar2 = true;
    }
    else if (uVar3 == 7) {
      bVar1 = true;
    }
    local_38 = local_38->next;
  } while( true );
}

Assistant:

static int x509_crt_check_san(const mbedtls_x509_sequence *san,
                              const char *cn, size_t cn_len)
{
    int san_ip = 0;
    int san_uri = 0;
    /* Prioritize DNS name over other subtypes due to popularity */
    for (const mbedtls_x509_sequence *cur = san; cur != NULL; cur = cur->next) {
        switch ((unsigned char) cur->buf.tag & MBEDTLS_ASN1_TAG_VALUE_MASK) {
            case MBEDTLS_X509_SAN_DNS_NAME:
                if (x509_crt_check_cn(&cur->buf, cn, cn_len) == 0) {
                    return 0;
                }
                break;
            case MBEDTLS_X509_SAN_IP_ADDRESS:
                san_ip = 1;
                break;
            case MBEDTLS_X509_SAN_UNIFORM_RESOURCE_IDENTIFIER:
                san_uri = 1;
                break;
            /* (We may handle other types here later.) */
            default: /* Unrecognized type */
                break;
        }
    }
    if (san_ip) {
        if (x509_crt_check_san_ip(san, cn, cn_len) == 0) {
            return 0;
        }
    }
    if (san_uri) {
        if (x509_crt_check_san_uri(san, cn, cn_len) == 0) {
            return 0;
        }
    }

    return -1;
}